

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O0

void aom_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,int ref_stride,
               int subpel_search)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int use_hbd_buf;
  scale_factors *sf_00;
  int16_t *piVar5;
  int16_t *piVar6;
  int in_ECX;
  int in_EDX;
  longlong in_RSI;
  MACROBLOCKD *in_RDI;
  uint8_t *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar7;
  __m128i v;
  __m128i v_00;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  uint8_t *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int intermediate_height;
  uint8_t *temp_start_vert;
  uint8_t *temp_start_horiz;
  uint8_t *ref_start;
  int16_t *kernel_y;
  int16_t *kernel_x;
  uint8_t temp [36864];
  int16_t *kernel_1;
  int16_t *kernel;
  __m128i reg;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  int i_2;
  __m128i s1;
  __m128i s0;
  int i_1;
  int j;
  int i;
  int filter_taps;
  InterpFilterParams *filter;
  int_interpfilters filters;
  InterPredParams inter_pred_params;
  buf_2d *pre_buf;
  buf_2d *dst_buf;
  macroblockd_plane *pd;
  int mi_y;
  int mi_x;
  int plane;
  int is_scaled;
  scale_factors *sf;
  int is_intrabc;
  int ref_num;
  MB_MODE_INFO *mi;
  undefined8 in_stack_ffffffffffff6c88;
  undefined4 uVar8;
  InterPredParams *inter_pred_params_00;
  undefined4 in_stack_ffffffffffff6c90;
  int iVar9;
  undefined4 in_stack_ffffffffffff6c94;
  int in_stack_ffffffffffff6c9c;
  int in_stack_ffffffffffff6ca0;
  int iVar10;
  int in_stack_ffffffffffff6ca4;
  int in_stack_ffffffffffff6cbc;
  InterPredParams *in_stack_ffffffffffff6cc0;
  undefined8 in_stack_ffffffffffff6cc8;
  int_interpfilters interp_filters;
  uint8_t *puVar11;
  int in_stack_ffffffffffff6ce0;
  int is_intrabc_00;
  buf_2d *pbVar12;
  undefined4 in_stack_ffffffffffff6d08;
  undefined4 in_stack_ffffffffffff6d0c;
  uint8_t local_92c8 [36864];
  int16_t *local_2c8;
  int16_t *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  int local_25c;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  InterpFilterParams *local_228;
  int_interpfilters local_21c;
  undefined1 local_218 [96];
  undefined1 auStack_1b8 [168];
  buf_2d *local_110;
  buf_2d *local_108;
  macroblockd_plane *local_100;
  int local_f8;
  int local_f4;
  undefined4 local_f0;
  int local_ec;
  scale_factors *local_e8;
  int local_e0;
  undefined4 local_dc;
  MB_MODE_INFO *local_d8;
  uint8_t *local_d0;
  int local_c0;
  int local_bc;
  long local_b8;
  MACROBLOCKD *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  interp_filters.as_int = (uint32_t)((ulong)in_stack_ffffffffffff6cc8 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffff6c88 >> 0x20);
  local_d0 = in_R9;
  if (in_RDI != (MACROBLOCKD *)0x0) {
    local_d8 = *in_RDI->mi;
    local_dc = 0;
    local_c0 = in_ECX;
    local_bc = in_EDX;
    local_b8 = in_RSI;
    local_b0 = in_RDI;
    local_e0 = is_intrabc_block(local_d8);
    if (local_e0 == 0) {
      sf_00 = local_b0->block_ref_scale_factors[0];
    }
    else {
      sf_00 = (scale_factors *)(local_b8 + 0x110);
    }
    local_e8 = sf_00;
    local_ec = av1_is_scaled((scale_factors *)
                             CONCAT44(in_stack_ffffffffffff6c94,in_stack_ffffffffffff6c90));
    if (local_ec != 0) {
      local_f0 = 0;
      local_f4 = local_c0 << 2;
      local_f8 = local_bc << 2;
      local_100 = local_b0->plane;
      local_108 = &local_b0->plane[0].dst;
      pbVar12 = local_108;
      if (local_e0 == 0) {
        pbVar12 = local_b0->plane[0].pre;
      }
      local_110 = pbVar12;
      get_conv_params(in_stack_ffffffffffff6ca4,in_stack_ffffffffffff6ca0,in_stack_ffffffffffff6c9c)
      ;
      is_intrabc_00 = (int)pbVar12;
      memcpy(auStack_1b8,local_218,0x30);
      local_21c = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      use_hbd_buf = local_f4 >> ((byte)local_100->subsampling_x & 0x1f);
      iVar10 = local_100->subsampling_y;
      iVar9 = local_b0->bd;
      is_cur_buf_hbd(local_b0);
      inter_pred_params_00 = (InterPredParams *)CONCAT44(uVar8,iVar10);
      iVar10 = local_e0;
      av1_init_inter_params
                (in_stack_ffffffffffff6cc0,in_stack_ffffffffffff6cbc,local_21c.as_int,
                 (int)((ulong)local_110 >> 0x20),(int)local_110,(int)((ulong)local_e8 >> 0x20),
                 in_stack_ffffffffffff6ce0,in_stack_00000010,use_hbd_buf,is_intrabc_00,sf_00,
                 (buf_2d *)CONCAT44(in_stack_ffffffffffff6d0c,in_stack_ffffffffffff6d08),
                 interp_filters);
      av1_enc_build_one_inter_predictor
                ((uint8_t *)CONCAT44(in_stack_ffffffffffff6ca4,iVar10),in_stack_ffffffffffff6c9c,
                 (MV *)CONCAT44(in_stack_ffffffffffff6c94,iVar9),inter_pred_params_00);
      return;
    }
    local_ec = 0;
  }
  local_228 = av1_get_filter(in_stack_00000038);
  local_22c = 8;
  if (in_stack_00000038 < 3) {
    local_22c = 4;
  }
  if ((in_stack_00000018 == 0) && (in_stack_00000020 == 0)) {
    if (in_stack_00000008 < 0x10) {
      if (in_stack_00000008 < 8) {
        for (local_25c = 0; local_25c < in_stack_00000010; local_25c = local_25c + 1) {
          xx_loadl_64(in_stack_00000028);
          local_278 = extraout_XMM0_Qa_00;
          uStack_270 = extraout_XMM0_Qb_00;
          xx_loadl_64(in_stack_00000028 + in_stack_00000030);
          local_288 = extraout_XMM0_Qa_01;
          uStack_280 = extraout_XMM0_Qb_01;
          xx_loadl_64(in_stack_00000028 + in_stack_00000030 * 2);
          local_298 = extraout_XMM0_Qa_02;
          uStack_290 = extraout_XMM0_Qb_02;
          alVar7 = xx_loadl_64(in_stack_00000028 + in_stack_00000030 * 3);
          local_38 = local_278;
          uVar4 = local_38;
          uStack_30 = uStack_270;
          local_48 = local_288;
          uVar3 = local_48;
          uStack_40 = uStack_280;
          local_38._0_4_ = (undefined4)local_278;
          local_38._4_4_ = (undefined4)((ulong)local_278 >> 0x20);
          local_48._0_4_ = (undefined4)local_288;
          local_48._4_4_ = (undefined4)((ulong)local_288 >> 0x20);
          local_58 = local_298;
          uVar2 = local_58;
          uStack_50 = uStack_290;
          local_58._0_4_ = (undefined4)local_298;
          local_58._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
          local_68 = (undefined4)extraout_XMM0_Qa_03;
          uStack_64 = (undefined4)((ulong)extraout_XMM0_Qa_03 >> 0x20);
          local_98 = (undefined4)local_38;
          uStack_94 = (undefined4)local_48;
          uStack_90 = local_38._4_4_;
          uStack_8c = local_48._4_4_;
          local_a8 = (undefined4)local_58;
          uStack_a4 = local_68;
          uStack_a0 = local_58._4_4_;
          uStack_9c = uStack_64;
          local_2b8 = CONCAT44((undefined4)local_48,(undefined4)local_38);
          uStack_2b0 = CONCAT44(local_68,(undefined4)local_58);
          alVar7[0] = in_RSI;
          local_58 = uVar2;
          local_48 = uVar3;
          local_38 = uVar4;
          xx_storeu_128(local_d0,alVar7);
          local_d0 = local_d0 + 0x10;
          in_stack_00000028 = in_stack_00000028 + (in_stack_00000030 << 2);
        }
      }
      else {
        for (local_238 = 0; local_238 < in_stack_00000010; local_238 = local_238 + 2) {
          xx_loadl_64(in_stack_00000028);
          local_248 = extraout_XMM0_Qa;
          uStack_240 = extraout_XMM0_Qb;
          alVar7 = xx_loadl_64(in_stack_00000028 + in_stack_00000030);
          v_00[1] = alVar7[1];
          local_78 = local_248;
          uStack_70 = uStack_240;
          v_00[0] = in_RSI;
          xx_storeu_128(local_d0,v_00);
          local_d0 = local_d0 + 0x10;
          in_stack_00000028 = in_stack_00000028 + (in_stack_00000030 << 1);
        }
      }
    }
    else {
      for (local_230 = 0; local_230 < in_stack_00000010; local_230 = local_230 + 1) {
        for (local_234 = 0; puVar11 = local_d0, local_234 < in_stack_00000008;
            local_234 = local_234 + 0x10) {
          alVar7 = xx_loadu_128(in_stack_00000028);
          v[1] = alVar7[1];
          v[0] = in_RSI;
          xx_storeu_128(puVar11,v);
          local_d0 = local_d0 + 0x10;
          in_stack_00000028 = in_stack_00000028 + 0x10;
        }
        in_stack_00000028 = in_stack_00000028 + (in_stack_00000030 - in_stack_00000008);
      }
    }
  }
  else if (in_stack_00000020 == 0) {
    local_2c0 = av1_get_interp_filter_subpel_kernel(local_228,in_stack_00000018 << 1);
    (*aom_convolve8_horiz)
              (in_stack_00000028,(long)in_stack_00000030,local_d0,(long)in_stack_00000008,local_2c0,
               0x10,(int16_t *)0x0,-1,in_stack_00000008,in_stack_00000010);
  }
  else if (in_stack_00000018 == 0) {
    local_2c8 = av1_get_interp_filter_subpel_kernel(local_228,in_stack_00000020 << 1);
    (*aom_convolve8_vert)
              (in_stack_00000028,(long)in_stack_00000030,local_d0,(long)in_stack_00000008,
               (int16_t *)0x0,-1,local_2c8,0x10,in_stack_00000008,in_stack_00000010);
  }
  else {
    piVar5 = av1_get_interp_filter_subpel_kernel(local_228,in_stack_00000018 << 1);
    piVar6 = av1_get_interp_filter_subpel_kernel(local_228,in_stack_00000020 << 1);
    if (in_stack_00000038 < 3) {
      puVar11 = local_92c8 + ((local_22c >> 1) << 7);
    }
    else {
      puVar11 = local_92c8;
    }
    uVar1 = local_228->taps;
    (*aom_convolve8_horiz)
              (in_stack_00000028 + -(long)(in_stack_00000030 * ((local_22c >> 1) + -1)),
               (long)in_stack_00000030,puVar11,0x80,piVar5,0x10,(int16_t *)0x0,-1,in_stack_00000008,
               ((in_stack_00000010 + -1) * 8 + in_stack_00000020 >> 3) + local_22c);
    (*aom_convolve8_vert)
              (local_92c8 + (((int)(uint)uVar1 >> 1) + -1) * 0x80,0x80,local_d0,
               (long)in_stack_00000008,(int16_t *)0x0,-1,piVar6,0x10,in_stack_00000008,
               in_stack_00000010);
  }
  return;
}

Assistant:

void aom_upsampled_pred_sse2(MACROBLOCKD *xd, const struct AV1Common *const cm,
                             int mi_row, int mi_col, const MV *const mv,
                             uint8_t *comp_pred, int width, int height,
                             int subpel_x_q3, int subpel_y_q3,
                             const uint8_t *ref, int ref_stride,
                             int subpel_search) {
  // expect xd == NULL only in tests
  if (xd != NULL) {
    const MB_MODE_INFO *mi = xd->mi[0];
    const int ref_num = 0;
    const int is_intrabc = is_intrabc_block(mi);
    const struct scale_factors *const sf =
        is_intrabc ? &cm->sf_identity : xd->block_ref_scale_factors[ref_num];
    const int is_scaled = av1_is_scaled(sf);

    if (is_scaled) {
      int plane = 0;
      const int mi_x = mi_col * MI_SIZE;
      const int mi_y = mi_row * MI_SIZE;
      const struct macroblockd_plane *const pd = &xd->plane[plane];
      const struct buf_2d *const dst_buf = &pd->dst;
      const struct buf_2d *const pre_buf =
          is_intrabc ? dst_buf : &pd->pre[ref_num];

      InterPredParams inter_pred_params;
      inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
      const int_interpfilters filters =
          av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      av1_init_inter_params(
          &inter_pred_params, width, height, mi_y >> pd->subsampling_y,
          mi_x >> pd->subsampling_x, pd->subsampling_x, pd->subsampling_y,
          xd->bd, is_cur_buf_hbd(xd), is_intrabc, sf, pre_buf, filters);
      av1_enc_build_one_inter_predictor(comp_pred, width, mv,
                                        &inter_pred_params);
      return;
    }
  }

  const InterpFilterParams *filter = av1_get_filter(subpel_search);
  // (TODO:yunqing) 2-tap case uses 4-tap functions since there is no SIMD for
  // 2-tap yet.
  int filter_taps = (subpel_search <= USE_4_TAPS) ? 4 : SUBPEL_TAPS;

  if (!subpel_x_q3 && !subpel_y_q3) {
    if (width >= 16) {
      int i;
      assert(!(width & 15));
      /*Read 16 pixels one row at a time.*/
      for (i = 0; i < height; i++) {
        int j;
        for (j = 0; j < width; j += 16) {
          xx_storeu_128(comp_pred, xx_loadu_128(ref));
          comp_pred += 16;
          ref += 16;
        }
        ref += ref_stride - width;
      }
    } else if (width >= 8) {
      int i;
      assert(!(width & 7));
      assert(!(height & 1));
      /*Read 8 pixels two rows at a time.*/
      for (i = 0; i < height; i += 2) {
        __m128i s0 = xx_loadl_64(ref + 0 * ref_stride);
        __m128i s1 = xx_loadl_64(ref + 1 * ref_stride);
        xx_storeu_128(comp_pred, _mm_unpacklo_epi64(s0, s1));
        comp_pred += 16;
        ref += 2 * ref_stride;
      }
    } else {
      int i;
      assert(!(width & 3));
      assert(!(height & 3));
      /*Read 4 pixels four rows at a time.*/
      for (i = 0; i < height; i++) {
        const __m128i row0 = xx_loadl_64(ref + 0 * ref_stride);
        const __m128i row1 = xx_loadl_64(ref + 1 * ref_stride);
        const __m128i row2 = xx_loadl_64(ref + 2 * ref_stride);
        const __m128i row3 = xx_loadl_64(ref + 3 * ref_stride);
        const __m128i reg = _mm_unpacklo_epi64(_mm_unpacklo_epi32(row0, row1),
                                               _mm_unpacklo_epi32(row2, row3));
        xx_storeu_128(comp_pred, reg);
        comp_pred += 16;
        ref += 4 * ref_stride;
      }
    }
  } else if (!subpel_y_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    aom_convolve8_horiz(ref, ref_stride, comp_pred, width, kernel, 16, NULL, -1,
                        width, height);
  } else if (!subpel_x_q3) {
    const int16_t *const kernel =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    aom_convolve8_vert(ref, ref_stride, comp_pred, width, NULL, -1, kernel, 16,
                       width, height);
  } else {
    DECLARE_ALIGNED(16, uint8_t,
                    temp[((MAX_SB_SIZE * 2 + 16) + 16) * MAX_SB_SIZE]);
    const int16_t *const kernel_x =
        av1_get_interp_filter_subpel_kernel(filter, subpel_x_q3 << 1);
    const int16_t *const kernel_y =
        av1_get_interp_filter_subpel_kernel(filter, subpel_y_q3 << 1);
    const uint8_t *ref_start = ref - ref_stride * ((filter_taps >> 1) - 1);
    uint8_t *temp_start_horiz = (subpel_search <= USE_4_TAPS)
                                    ? temp + (filter_taps >> 1) * MAX_SB_SIZE
                                    : temp;
    uint8_t *temp_start_vert = temp + MAX_SB_SIZE * ((filter->taps >> 1) - 1);
    int intermediate_height =
        (((height - 1) * 8 + subpel_y_q3) >> 3) + filter_taps;
    assert(intermediate_height <= (MAX_SB_SIZE * 2 + 16) + 16);
    aom_convolve8_horiz(ref_start, ref_stride, temp_start_horiz, MAX_SB_SIZE,
                        kernel_x, 16, NULL, -1, width, intermediate_height);
    aom_convolve8_vert(temp_start_vert, MAX_SB_SIZE, comp_pred, width, NULL, -1,
                       kernel_y, 16, width, height);
  }
}